

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

string * __thiscall
phosg::Image::save_abi_cxx11_(string *__return_storage_ptr__,Image *this,Format format)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  size_t __n;
  ulong uVar4;
  long lVar5;
  runtime_error *prVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  size_type __n_00;
  ulong uVar10;
  int iVar11;
  long lVar12;
  size_t size;
  unique_ptr<void,_void_(*)(void_*)> row_data_unique;
  uint8_t row_padding_data [4];
  uLongf idat_size;
  be_uint32_t gAMA;
  uint8_t SIG [8];
  anon_struct_13_7_88857fac IHDR;
  char header [256];
  code *local_1a0;
  char *local_198;
  anon_class_8_1_6971b95b local_190;
  undefined4 local_188;
  undefined4 uStack_184;
  void *local_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  size_t local_168;
  size_type local_160;
  undefined4 local_154;
  char local_150 [8];
  uint local_148;
  uint local_144;
  undefined1 local_140;
  byte local_13f;
  undefined2 local_13e;
  undefined1 local_13c;
  undefined1 local_138 [34];
  int local_116;
  undefined8 local_112;
  undefined8 uStack_10a;
  undefined8 local_102;
  undefined8 uStack_fa;
  undefined4 local_f2;
  undefined4 local_be;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_190.result = __return_storage_ptr__;
  switch(format) {
  case GRAYSCALE_PPM:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save grayscale ppm files");
    break;
  case COLOR_PPM:
    pcVar9 = "P6 %zu %zu %lu\n";
    if (this->has_alpha != false) {
      pcVar9 = "P7\nWIDTH %zu\nHEIGHT %zu\nDEPTH 4\nMAXVAL %lu\nTUPLTYPE RGB_ALPHA\nENDHDR\n";
    }
    snprintf(local_138,0x100,pcVar9,this->width,this->height,this->max_value);
    __n = strlen(local_138);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_138,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)(this->data).as8,
               (ulong)(this->channel_width >> 3) * ((ulong)this->has_alpha + 3) *
               this->height * this->width);
    return __return_storage_ptr__;
  case WINDOWS_BITMAP:
    if (this->channel_width == '\b') {
      bVar2 = this->has_alpha;
      local_174 = bVar2 + 3;
      local_16c = (int)this->width;
      uVar3 = -(local_16c * local_174) & 3;
      local_188 = 0;
      local_178 = (int)this->height;
      iVar11 = local_178 * local_16c;
      lVar12 = 0x28;
      if (bVar2 != false) {
        lVar12 = 0x7c;
      }
      local_170 = iVar11 * 4;
      if (bVar2 == false) {
        local_170 = 0;
      }
      local_160 = lVar12 + 0xe;
      memset(local_138,0,0x8a);
      local_138._0_2_ = 0x4d42;
      local_138._10_4_ = (undefined4)local_160;
      local_138._2_4_ = iVar11 * local_174 + local_138._10_4_ + local_178 * uVar3;
      local_138._6_4_ = 0;
      local_138._14_4_ = (undefined4)lVar12;
      local_138._18_4_ = local_16c;
      local_138._22_4_ = local_178;
      local_138._26_2_ = 1;
      local_138._28_2_ = (ushort)bVar2 * 8 + 0x18;
      local_138._30_4_ = (uint)bVar2 + (uint)bVar2 * 2;
      local_116 = local_170;
      local_112 = 0xb1200000b12;
      uStack_10a = 0;
      if (bVar2 == true) {
        local_102 = 0xff00000000ff;
        uStack_fa = 0xff00000000ff0000;
        local_f2 = 0x73524742;
        local_be = 8;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,local_138,local_160);
      if (this->has_alpha == true) {
        lVar12 = this->height;
        if (lVar12 < 1) {
          return __return_storage_ptr__;
        }
        lVar7 = lVar12 * 4;
        lVar12 = lVar12 + 1;
        do {
          lVar7 = lVar7 + -4;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)(lVar7 * this->width + (long)(this->data).raw),
                     this->width << 2);
          lVar12 = lVar12 + -1;
        } while (1 < lVar12);
        return __return_storage_ptr__;
      }
      malloc_unique((phosg *)&local_1a0,this->width * 3);
      pcVar9 = local_198;
      lVar12 = this->height;
      if (0 < lVar12) {
        lVar7 = lVar12 * 3;
        do {
          lVar7 = lVar7 + -3;
          lVar8 = this->width;
          if (lVar8 < 1) {
            __n_00 = lVar8 * 3;
          }
          else {
            lVar5 = 0;
            do {
              pcVar9[lVar5] = *(char *)((long)(this->data).raw + lVar5 + 2 + lVar8 * lVar7);
              pcVar9[lVar5 + 1] =
                   *(char *)((long)(this->data).raw + lVar5 + 1 + this->width * lVar7);
              pcVar9[lVar5 + 2] = *(char *)((long)(this->data).raw + lVar5 + this->width * lVar7);
              lVar5 = lVar5 + 3;
              lVar8 = this->width;
              __n_00 = lVar8 * 3;
            } while (SBORROW8(lVar5,__n_00) != lVar5 + lVar8 * -3 < 0);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,pcVar9,__n_00);
          if ((ulong)uVar3 != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,(char *)&local_188,(ulong)uVar3);
          }
          bVar2 = 1 < lVar12;
          lVar12 = lVar12 + -1;
        } while (bVar2);
      }
      if (local_198 == (char *)0x0) {
        return __return_storage_ptr__;
      }
      (*local_1a0)();
      return __return_storage_ptr__;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save bmp with more than 8-bit channels");
    break;
  case PNG:
    if (this->channel_width == '\b') {
      local_150[0] = -0x77;
      local_150[1] = 'P';
      local_150[2] = 'N';
      local_150[3] = 'G';
      local_150[4] = '\r';
      local_150[5] = '\n';
      local_150[6] = '\x1a';
      local_150[7] = '\n';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,local_150,8);
      uVar3 = (uint)this->width;
      local_148 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      uVar3 = (uint)this->height;
      local_144 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      local_140 = 8;
      local_13f = this->has_alpha << 2 | 2;
      local_13e = 0;
      local_13c = 0;
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"IHDR",&local_148,(be_uint32_t)0xd000000,&local_190);
      local_154 = 0x8fb10000;
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"gAMA",&local_154,(be_uint32_t)0x4000000,&local_190);
      lVar12 = (ulong)this->has_alpha + 3;
      size = (this->width * lVar12 + 1) * this->height;
      malloc_unique((phosg *)&local_1a0,size);
      if (this->height != 0) {
        uVar4 = 0;
        uVar10 = 1;
        do {
          lVar7 = this->width * lVar12;
          pvVar1 = (this->data).raw;
          local_198[(lVar7 + 1) * uVar4] = '\0';
          memcpy(local_198 + (lVar7 + 1) * uVar4 + 1,(void *)(lVar7 * uVar4 + (long)pvVar1),
                 this->width * lVar12);
          bVar2 = uVar10 < (ulong)this->height;
          uVar4 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar2);
      }
      local_168 = compressBound(size);
      malloc_unique((phosg *)&local_188,local_168);
      uVar3 = compress2(local_180,&local_168,local_198,size,9);
      if (uVar3 == 0) {
        write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IDAT",local_180,
                   (be_uint32_t)
                   ((uint)local_168 >> 0x18 | ((uint)local_168 & 0xff0000) >> 8 |
                    ((uint)local_168 & 0xff00) << 8 | (uint)local_168 << 0x18),&local_190);
        write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IEND",(void *)0x0,(be_uint32_t)0x0,&local_190);
        if (local_180 != (void *)0x0) {
          (*(code *)CONCAT44(uStack_184,local_188))();
        }
        if (local_198 == (char *)0x0) {
          return __return_storage_ptr__;
        }
        (*local_1a0)();
        return __return_storage_ptr__;
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      string_printf_abi_cxx11_
                ((string *)local_138,"zlib error compressing png data: %d",(ulong)uVar3);
      ::std::runtime_error::runtime_error(prVar6,(string *)local_138);
      __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save png with more than 8-bit channels");
    break;
  default:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"unknown file format in Image::save()");
  }
  __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string Image::save(Format format) const {
  string result;
  this->save_helper(format, [&result](const void* data, size_t size) {
    result.append(reinterpret_cast<const char*>(data), size);
  });
  return result;
}